

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O3

int readMPS_dense(char *filename,int mxNumRow,int mxNumCol,int *numRow,int *numCol,int *objSense,
                 double *objOffset,vector<double,_std::allocator<double>_> *A_cw,
                 vector<double,_std::allocator<double>_> *rhs,
                 vector<double,_std::allocator<double>_> *cost,
                 vector<double,_std::allocator<double>_> *lb,
                 vector<double,_std::allocator<double>_> *ub,
                 vector<int,_std::allocator<int>_> *integerColumn)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  vector<double,_std::allocator<double>_> Avalue;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  vector<double,_std::allocator<double>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  value_type_conflict1 local_38;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar4 = readMPS_sparse(filename,mxNumRow,mxNumCol,numRow,numCol,objSense,objOffset,&local_58,
                         &local_78,&local_98,rhs,cost,lb,ub,integerColumn);
  if (iVar4 == 0) {
    iVar4 = 0;
    printf("readMPS_dense: Model has %d rows and %d columns\n",(ulong)(uint)*numRow,
           (ulong)(uint)*numCol);
    printf("readMPS_dense: Objective sense is %d; Objective offset is %g\n",SUB84(*objOffset,0),
           (ulong)(uint)*objSense);
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (A_cw,(long)*numRow * (long)*numCol,&local_38);
    iVar1 = *numCol;
    if (0 < (long)iVar1) {
      iVar4 = *numRow;
      pdVar3 = (A_cw->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      iVar6 = *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar2 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7 + 1];
        if (iVar6 < iVar2) {
          lVar5 = (long)iVar6;
          do {
            pdVar3[lVar7 * iVar4 +
                   (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar5]] =
                 local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5];
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
        lVar7 = lVar7 + 1;
        iVar6 = iVar2;
      } while (lVar7 != iVar1);
      iVar4 = 0;
    }
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int readMPS_dense(const char *filename, int mxNumRow, int mxNumCol, 
		  int& numRow, int& numCol, int& objSense, double& objOffset,
		  vector<double>& A_cw,
		  vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		  vector<int>& integerColumn) {
  vector<int> Astart;
  vector<int> Aindex;
  vector<double> Avalue;
  int rtCd = readMPS_sparse(filename, mxNumRow, mxNumCol,
			    numRow, numCol, objSense, objOffset,
			    Astart, Aindex, Avalue,
			    rhs, cost, lb, ub,
			    integerColumn);
  if (rtCd) return rtCd;
#ifdef JAJH_dev
  printf("readMPS_dense: Model has %d rows and %d columns\n", numRow, numCol);
  printf("readMPS_dense: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  A_cw.assign(numCol*numRow,0);
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int el_n = Astart[c_n]; el_n < Astart[c_n+1]; el_n++) {
      int r_n = Aindex[el_n];
      double r_v = Avalue[el_n];
      A_cw[r_n+c_n*numRow] = r_v;
    }
  }
  return 0;
}